

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,bool indent)

{
  bool bVar1;
  
  if (text->_M_string_length != 0) {
    bVar1 = this->m_tagIsOpen;
    if (bVar1 == true) {
      std::__ostream_insert<char,std::char_traits<char>>(this->m_os,">\n",2);
      this->m_tagIsOpen = false;
    }
    if ((bVar1 & indent) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->m_os,(this->m_indent)._M_dataplus._M_p,(this->m_indent)._M_string_length);
    }
    writeEncodedText(this,text);
    this->m_needsNewline = true;
  }
  return this;
}

Assistant:

XmlWriter& writeText( std::string const& text, bool indent = true ) {
            if( !text.empty() ){
                bool tagWasOpen = m_tagIsOpen;
                ensureTagClosed();
                if( tagWasOpen && indent )
                    stream() << m_indent;
                writeEncodedText( text );
                m_needsNewline = true;
            }
            return *this;
        }